

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O3

void __thiscall DIS::RecordSpecification::marshal(RecordSpecification *this,DataStream *dataStream)

{
  undefined8 uVar1;
  pointer pRVar2;
  ulong uVar3;
  long lVar4;
  RecordSpecificationElement x;
  RecordSpecificationElement local_48;
  
  DataStream::operator<<
            (dataStream,
             (int)((ulong)((long)(this->_recordSets).
                                 super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_recordSets).
                                super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  pRVar2 = (this->_recordSets).
           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_recordSets).
      super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar2) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      local_48._vptr_RecordSpecificationElement =
           (_func_int **)&PTR__RecordSpecificationElement_001b5b30;
      uVar1 = *(undefined8 *)((long)&pRVar2->_vptr_RecordSpecificationElement + lVar4);
      local_48._16_7_ =
           SUB87((ulong)*(undefined8 *)((long)&pRVar2->_vptr_RecordSpecificationElement + lVar4 + 7)
                 >> 8,0);
      local_48._8_7_ = SUB87(uVar1,0);
      local_48._recordSetSerialNumber._3_1_ = (undefined1)((ulong)uVar1 >> 0x38);
      RecordSpecificationElement::marshal(&local_48,dataStream);
      RecordSpecificationElement::~RecordSpecificationElement(&local_48);
      uVar3 = uVar3 + 1;
      pRVar2 = (this->_recordSets).
               super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
    } while (uVar3 < (ulong)(((long)(this->_recordSets).
                                    super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void RecordSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned int )_recordSets.size();

     for(size_t idx = 0; idx < _recordSets.size(); idx++)
     {
        RecordSpecificationElement x = _recordSets[idx];
        x.marshal(dataStream);
     }

}